

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

char * lws_wsi_client_stash_item(lws *wsi,int stash_idx,int hdr_idx)

{
  char *pcVar1;
  
  if (wsi->stash != (client_info_stash *)0x0) {
    return wsi->stash->cis[stash_idx];
  }
  pcVar1 = lws_hdr_simple_ptr(wsi,hdr_idx);
  return pcVar1;
}

Assistant:

const char *
lws_wsi_client_stash_item(struct lws *wsi, int stash_idx, int hdr_idx)
{
	/* try the generic client stash */
	if (wsi->stash)
		return wsi->stash->cis[stash_idx];

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	/* if not, use the ah stash if applicable */
	return lws_hdr_simple_ptr(wsi, (enum lws_token_indexes)hdr_idx);
#else
	return NULL;
#endif
}